

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_datablobsources.c
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  uint uVar5;
  uint32_t count;
  hrgls_API api;
  hrgls_APICreateParams params;
  char *name;
  hrgls_APIDataBlobSourceInfo dbsInfo;
  uint local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  iVar2 = hrgls_APICreateParametersCreate(&local_38);
  if (iVar2 == 0) {
    iVar2 = hrgls_APICreate(&local_40,local_38);
    if (iVar2 == 0) {
      iVar2 = hrgls_APICreateParametersDestroy(local_38);
      if (iVar2 == 0) {
        iVar2 = hrgls_APIGetAvailableDataBlobSourceCount(local_40,&local_44);
        if (iVar2 == 0) {
          printf("Found %d DataBlobSources\n",(ulong)local_44);
          if (local_44 != 0) {
            uVar5 = 0;
            do {
              iVar2 = hrgls_APIGetAvailableDataBlobSourceInfo(local_40,uVar5,&local_28);
              pFVar1 = _stderr;
              if (iVar2 != 0) {
                uVar4 = hrgls_ErrorMessage(iVar2);
                fprintf(pFVar1,"Could not get DataBlobSource info for DataBlobSource %d: %s\n",
                        (ulong)uVar5,uVar4);
                return 0x12d;
              }
              iVar2 = hrgls_APIDataBlobSourceGetName(local_28,&local_30);
              pFVar1 = _stderr;
              if (iVar2 != 0) {
                uVar4 = hrgls_ErrorMessage(iVar2);
                fprintf(pFVar1,"Could not get DataBlobSource name for DataBlobSource %d: %s\n",
                        (ulong)uVar5,uVar4);
                return 0x12e;
              }
              printf(" DataBlobSource name: %s\n",local_30);
              uVar5 = uVar5 + 1;
            } while (uVar5 < local_44);
          }
          iVar3 = hrgls_APIDestroy(local_40);
          iVar2 = 0;
          if (iVar3 != 0) {
            main_cold_5();
            iVar2 = 0x14;
          }
        }
        else {
          main_cold_4();
          iVar2 = 3;
        }
      }
      else {
        main_cold_3();
        iVar2 = 1000;
      }
    }
    else {
      main_cold_2();
      iVar2 = 2;
    }
  }
  else {
    main_cold_1();
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, const char *argv[])
{
  // Get a base API object, specifying default parameters.
  hrgls_Status status;
  hrgls_APICreateParams params;
  status = hrgls_APICreateParametersCreate(&params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not create API open parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 1;
  }

  hrgls_API api;
  status = hrgls_APICreate(&api, params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not create API with default parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 2;
  }
  status = hrgls_APICreateParametersDestroy(params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not destroy API open parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 1000;
  }

  // Find out how many DataBlobSources are in the system, which will also latch the data
  // on the DataBlobSources.
  uint32_t count;
  if (hrgls_STATUS_OKAY != (status = hrgls_APIGetAvailableDataBlobSourceCount(api, &count))) {
    fprintf(stderr, "Could not get number of available DataBlobSources: %s\n",
      hrgls_ErrorMessage(status));
    return 3;
  }
  printf("Found %d DataBlobSources\n", count);

  // Read each DataBlobSource's information.
  for (uint32_t i = 0; i < count; i++) {
    hrgls_APIDataBlobSourceInfo dbsInfo;
    if (hrgls_STATUS_OKAY != (status = hrgls_APIGetAvailableDataBlobSourceInfo(api, i, &dbsInfo))) {
      fprintf(stderr, "Could not get DataBlobSource info for DataBlobSource %d: %s\n", i,
        hrgls_ErrorMessage(status));
      return 301;
    }

    // Get and print the DataBlobSource name.
    const char *name;
    if (hrgls_STATUS_OKAY != (status = hrgls_APIDataBlobSourceGetName(dbsInfo, &name))) {
      fprintf(stderr, "Could not get DataBlobSource name for DataBlobSource %d: %s\n", i,
        hrgls_ErrorMessage(status));
      return 302;
    }
    printf(" DataBlobSource name: %s\n", name);
  }

  status = hrgls_APIDestroy(api);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not destroy API with default parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 20;
  }

  return 0;
}